

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# convolution_3x3.h
# Opt level: O1

void ncnn::conv3x3s1_sse(Mat *bottom_blob,Mat *top_blob,Mat *_kernel,Mat *_bias,Option *opt)

{
  float *pfVar1;
  float *pfVar2;
  float fVar3;
  float fVar4;
  float fVar5;
  float fVar6;
  undefined8 uVar7;
  undefined8 uVar8;
  int iVar9;
  uint uVar10;
  int iVar11;
  uint uVar12;
  void *pvVar13;
  void *pvVar14;
  void *pvVar15;
  size_t sVar16;
  size_t sVar17;
  void *pvVar18;
  long lVar19;
  float fVar20;
  float fVar21;
  float fVar22;
  float fVar23;
  float fVar24;
  float fVar25;
  float fVar26;
  float fVar27;
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  uint uVar31;
  int iVar32;
  int iVar33;
  long lVar34;
  ulong uVar35;
  float *pfVar36;
  long lVar37;
  long lVar38;
  long lVar39;
  float *pfVar40;
  float *pfVar41;
  uint uVar42;
  float *pfVar43;
  long lVar44;
  float *pfVar45;
  float *pfVar46;
  float *pfVar47;
  long lVar48;
  int iVar49;
  undefined1 auVar50 [16];
  undefined4 uVar51;
  undefined1 auVar52 [16];
  undefined1 auVar53 [16];
  float fVar54;
  float fVar55;
  float fVar56;
  float fVar57;
  int remain;
  
  auVar30 = _DAT_0017b770;
  auVar29 = _DAT_0017b760;
  auVar28 = _DAT_0017aef0;
  iVar9 = top_blob->c;
  if (0 < (long)iVar9) {
    uVar10 = bottom_blob->c;
    iVar11 = top_blob->w;
    uVar12 = top_blob->h;
    pvVar13 = _kernel->data;
    pvVar14 = _bias->data;
    lVar48 = (long)bottom_blob->w;
    lVar38 = top_blob->cstep * top_blob->elemsize;
    uVar31 = top_blob->h * top_blob->w;
    pvVar15 = top_blob->data;
    lVar34 = (ulong)uVar31 - 1;
    sVar16 = bottom_blob->cstep;
    sVar17 = bottom_blob->elemsize;
    auVar50._8_4_ = (int)lVar34;
    auVar50._0_8_ = lVar34;
    auVar50._12_4_ = (int)((ulong)lVar34 >> 0x20);
    pvVar18 = bottom_blob->data;
    auVar50 = auVar50 ^ _DAT_0017aef0;
    lVar34 = lVar48 + 2;
    lVar39 = (long)pvVar15 + 0xc;
    lVar44 = 0;
    do {
      if (pvVar14 == (void *)0x0) {
        uVar51 = 0;
      }
      else {
        uVar51 = *(undefined4 *)((long)pvVar14 + lVar44 * 4);
      }
      if (0 < (int)uVar31) {
        uVar35 = 0;
        do {
          auVar52._8_4_ = (int)uVar35;
          auVar52._0_8_ = uVar35;
          auVar52._12_4_ = (int)(uVar35 >> 0x20);
          auVar53 = (auVar52 | auVar30) ^ auVar28;
          iVar32 = auVar50._4_4_;
          if ((bool)(~(iVar32 < auVar53._4_4_ ||
                      auVar50._0_4_ < auVar53._0_4_ && auVar53._4_4_ == iVar32) & 1)) {
            *(undefined4 *)(lVar39 + -0xc + uVar35 * 4) = uVar51;
          }
          if (auVar53._12_4_ <= auVar50._12_4_ &&
              (auVar53._8_4_ <= auVar50._8_4_ || auVar53._12_4_ != auVar50._12_4_)) {
            *(undefined4 *)(lVar39 + -8 + uVar35 * 4) = uVar51;
          }
          auVar52 = (auVar52 | auVar29) ^ auVar28;
          iVar33 = auVar52._4_4_;
          if (iVar33 <= iVar32 && (iVar33 != iVar32 || auVar52._0_4_ <= auVar50._0_4_)) {
            *(undefined4 *)(lVar39 + -4 + uVar35 * 4) = uVar51;
            *(undefined4 *)(lVar39 + uVar35 * 4) = uVar51;
          }
          uVar35 = uVar35 + 4;
        } while ((uVar31 + 3 & 0xfffffffc) != uVar35);
      }
      if (0 < (int)uVar10) {
        pfVar36 = (float *)(lVar38 * lVar44 + (long)pvVar15);
        iVar32 = uVar10 * 9 * (int)lVar44;
        uVar35 = 0;
        do {
          pfVar40 = (float *)(sVar16 * sVar17 * uVar35 + (long)pvVar18);
          lVar19 = uVar35 * 0x24;
          pfVar45 = pfVar40 + lVar48;
          pfVar47 = pfVar40 + lVar48 * 2;
          pfVar46 = pfVar36;
          uVar42 = 0;
          if (1 < (int)uVar12) {
            pfVar43 = pfVar40 + lVar48 * 3;
            pfVar41 = pfVar36;
            iVar33 = 0;
            do {
              pfVar41 = pfVar41 + iVar11;
              if (0 < iVar11) {
                lVar37 = 0;
                iVar49 = iVar11 + 1;
                do {
                  uVar7 = *(undefined8 *)((long)pfVar40 + lVar37 + 4);
                  uVar8 = *(undefined8 *)((long)pfVar45 + lVar37 + 4);
                  pfVar1 = (float *)((long)pvVar13 + lVar19 + (long)iVar32 * 4);
                  fVar20 = *pfVar1;
                  fVar21 = pfVar1[1];
                  fVar22 = pfVar1[2];
                  fVar23 = pfVar1[3];
                  pfVar1 = (float *)((long)pvVar13 + lVar19 + (long)iVar32 * 4 + 0x10);
                  fVar24 = *pfVar1;
                  fVar25 = pfVar1[1];
                  fVar26 = pfVar1[2];
                  fVar27 = pfVar1[3];
                  fVar3 = *(float *)((long)pfVar45 + lVar37);
                  fVar56 = (float)uVar8;
                  fVar57 = (float)((ulong)uVar8 >> 0x20);
                  fVar54 = (float)*(undefined8 *)((long)pfVar47 + lVar37);
                  fVar55 = (float)((ulong)*(undefined8 *)((long)pfVar47 + lVar37) >> 0x20);
                  fVar4 = *(float *)((long)pfVar47 + lVar37 + 8);
                  fVar5 = *(float *)((long)pvVar13 + lVar19 + (long)iVar32 * 4 + 0x20);
                  uVar8 = *(undefined8 *)((long)pfVar43 + lVar37);
                  fVar6 = *(float *)((long)pfVar43 + lVar37 + 8);
                  *(float *)((long)pfVar46 + lVar37) =
                       fVar55 * fVar27 + fVar3 * fVar23 + fVar57 * fVar25 + (float)uVar7 * fVar21 +
                       fVar54 * fVar26 + (float)((ulong)uVar7 >> 0x20) * fVar22 +
                       fVar56 * fVar24 + *(float *)((long)pfVar40 + lVar37) * fVar20 + fVar5 * fVar4
                       + *(float *)((long)pfVar46 + lVar37);
                  *(float *)((long)pfVar41 + lVar37) =
                       (float)((ulong)uVar8 >> 0x20) * fVar27 + fVar54 * fVar23 +
                       fVar4 * fVar25 + fVar20 * fVar3 +
                       (float)uVar8 * fVar26 + fVar57 * fVar22 + fVar55 * fVar24 + fVar21 * fVar56 +
                       fVar5 * fVar6 + *(float *)((long)pfVar41 + lVar37);
                  iVar49 = iVar49 + -1;
                  lVar37 = lVar37 + 4;
                } while (1 < iVar49);
                pfVar46 = (float *)((long)pfVar46 + lVar37);
                pfVar41 = (float *)((long)pfVar41 + lVar37);
                pfVar40 = (float *)((long)pfVar40 + lVar37);
                pfVar43 = (float *)((long)pfVar43 + lVar37);
                pfVar47 = (float *)((long)pfVar47 + lVar37);
                pfVar45 = (float *)((long)pfVar45 + lVar37);
              }
              pfVar40 = pfVar40 + lVar34;
              pfVar45 = pfVar45 + lVar34;
              pfVar47 = pfVar47 + lVar34;
              pfVar43 = pfVar43 + lVar34;
              pfVar46 = pfVar46 + iVar11;
              iVar49 = iVar33 + 3;
              iVar33 = iVar33 + 2;
              uVar42 = uVar12 & 0xfffffffe;
            } while (iVar49 < (int)uVar12);
          }
          if ((int)uVar42 < (int)uVar12) {
            do {
              iVar33 = iVar11 + 1;
              if (0 < iVar11) {
                do {
                  pfVar43 = pfVar40 + 1;
                  fVar3 = *pfVar40;
                  pfVar40 = pfVar40 + 1;
                  fVar4 = *pfVar45;
                  pfVar41 = pfVar45 + 1;
                  pfVar45 = pfVar45 + 1;
                  uVar7 = *(undefined8 *)pfVar47;
                  pfVar1 = pfVar47 + 2;
                  pfVar47 = pfVar47 + 1;
                  pfVar2 = (float *)((long)pvVar13 + lVar19 + (long)iVar32 * 4);
                  auVar52 = *(undefined1 (*) [16])((long)pvVar13 + lVar19 + (long)iVar32 * 4 + 0x10)
                  ;
                  *pfVar46 = (float)((ulong)uVar7 >> 0x20) * auVar52._12_4_ + fVar4 * pfVar2[3] +
                             (float)((ulong)*(undefined8 *)pfVar41 >> 0x20) * auVar52._4_4_ +
                             (float)*(undefined8 *)pfVar43 * pfVar2[1] +
                             (float)uVar7 * auVar52._8_4_ +
                             (float)((ulong)*(undefined8 *)pfVar43 >> 0x20) * pfVar2[2] +
                             (float)*(undefined8 *)pfVar41 * auVar52._0_4_ + fVar3 * *pfVar2 +
                             *(float *)((long)pvVar13 + lVar19 + (long)iVar32 * 4 + 0x20) * *pfVar1
                             + *pfVar46;
                  pfVar46 = pfVar46 + 1;
                  iVar33 = iVar33 + -1;
                } while (1 < iVar33);
              }
              pfVar40 = pfVar40 + 2;
              pfVar45 = pfVar45 + 2;
              pfVar47 = pfVar47 + 2;
              uVar42 = uVar42 + 1;
            } while (uVar42 != uVar12);
          }
          uVar35 = uVar35 + 1;
        } while (uVar35 != uVar10);
      }
      lVar44 = lVar44 + 1;
      lVar39 = lVar39 + lVar38;
    } while (lVar44 != iVar9);
  }
  return;
}

Assistant:

static void conv3x3s1_sse(const Mat& bottom_blob, Mat& top_blob, const Mat& _kernel, const Mat& _bias, const Option& opt)
{
    int w = bottom_blob.w;
    int inch = bottom_blob.c;

    int outw = top_blob.w;
    int outh = top_blob.h;
    int outch = top_blob.c;

    const float* kernel = _kernel;
    const float* bias = _bias;

    #pragma omp parallel for num_threads(opt.num_threads)
    for (int p=0; p<outch; p++)
    {
        Mat out = top_blob.channel(p);

        const float bias0 = bias ? bias[p] : 0.f;

        out.fill(bias0);

        for (int q=0; q<inch; q++)
        {
            float* outptr = out;
            float* outptr2 = outptr + outw;

            const float* img0 = bottom_blob.channel(q);

            const float* kernel0 = kernel + p*inch*9  + q*9;

            const float* r0 = img0;
            const float* r1 = img0 + w;
            const float* r2 = img0 + w*2;
            const float* r3 = img0 + w*3;

            const float* k0 = kernel0;
            const float* k1 = kernel0 + 3;
            const float* k2 = kernel0 + 6;

            int i = 0;

            for (; i+1 < outh; i+=2)
            {

                int remain = outw;

                for (; remain>0; remain--)
                {
                    float sum = 0;
                    float sum2 = 0;

                    sum += r0[0] * k0[0];
                    sum += r0[1] * k0[1];
                    sum += r0[2] * k0[2];
                    sum += r1[0] * k1[0];
                    sum += r1[1] * k1[1];
                    sum += r1[2] * k1[2];
                    sum += r2[0] * k2[0];
                    sum += r2[1] * k2[1];
                    sum += r2[2] * k2[2];

                    sum2 += r1[0] * k0[0];
                    sum2 += r1[1] * k0[1];
                    sum2 += r1[2] * k0[2];
                    sum2 += r2[0] * k1[0];
                    sum2 += r2[1] * k1[1];
                    sum2 += r2[2] * k1[2];
                    sum2 += r3[0] * k2[0];
                    sum2 += r3[1] * k2[1];
                    sum2 += r3[2] * k2[2];

                    *outptr += sum;
                    *outptr2 += sum2;

                    r0++;
                    r1++;
                    r2++;
                    r3++;
                    outptr++;
                    outptr2++;
                }

                r0 += 2 + w;
                r1 += 2 + w;
                r2 += 2 + w;
                r3 += 2 + w;

                outptr += outw;
                outptr2 += outw;
            }

            for (; i < outh; i++)
            {
                int remain = outw;

                for (; remain>0; remain--)
                {
                    float sum = 0;

                    sum += r0[0] * k0[0];
                    sum += r0[1] * k0[1];
                    sum += r0[2] * k0[2];
                    sum += r1[0] * k1[0];
                    sum += r1[1] * k1[1];
                    sum += r1[2] * k1[2];
                    sum += r2[0] * k2[0];
                    sum += r2[1] * k2[1];
                    sum += r2[2] * k2[2];

                    *outptr += sum;

                    r0++;
                    r1++;
                    r2++;
                    outptr++;
                }

                r0 += 2;
                r1 += 2;
                r2 += 2;
            }

        }
    }

}